

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgatexture.cpp
# Opt level: O3

void __thiscall FTGATexture::MakeTexture(FTGATexture *this)

{
  byte bVar1;
  BYTE BVar2;
  BYTE *pBVar3;
  ushort *buffer;
  ushort *puVar4;
  byte *pbVar5;
  char *pcVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  ushort uVar10;
  ulong uVar11;
  ulong uVar12;
  WORD WVar13;
  ushort *puVar14;
  uint uVar15;
  byte *pbVar16;
  char *pcVar17;
  long lVar18;
  BYTE a;
  BYTE b;
  BYTE g;
  BYTE r;
  WORD w;
  FWadLump lump;
  BYTE PaletteMap [256];
  BYTE aBStack_8138 [32689];
  byte local_187;
  byte local_186;
  byte local_185;
  ushort local_184;
  byte local_182;
  char local_181;
  byte local_180;
  short local_17f;
  short local_17d;
  byte local_17b;
  byte local_172;
  byte local_171;
  FWadLump local_170;
  BYTE local_138 [264];
  
  FWadCollection::OpenLumpNum(&local_170,&Wads,(this->super_FTexture).SourceLump);
  pBVar3 = (BYTE *)operator_new__((ulong)(this->super_FTexture).Height *
                                  (ulong)(this->super_FTexture).Width);
  this->Pixels = pBVar3;
  FWadLump::Read(&local_170,&local_182,0x12);
  FWadLump::Seek(&local_170,(ulong)local_182,1);
  if (local_181 != '\0') {
    memset(local_138,0,0x100);
    lVar18 = (long)local_17f;
    if ((lVar18 < 0x100) && (0 < local_17d)) {
      do {
        if (local_17b - 0xf < 2) {
          (*local_170.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])
                    (&local_170,&local_184,2);
          local_185 = (char)local_184 * '\b';
          local_186 = (byte)(local_184 >> 2) & 0xf8;
          local_187 = (byte)(local_184 >> 7) & 0xf8;
LAB_00661b26:
          aBStack_8138[0x7fb0] = -1;
LAB_00661b2a:
          BVar2 = FColorMatcher::Pick(&ColorMatcher,(uint)local_185,(uint)local_186,(uint)local_187)
          ;
        }
        else {
          if (local_17b == 0x18) {
            (*local_170.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])
                      (&local_170,aBStack_8138 + 0x7fb1,1);
            (*local_170.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])
                      (&local_170,aBStack_8138 + 0x7fb2,1);
            (*local_170.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])
                      (&local_170,aBStack_8138 + 0x7fb3,1);
            goto LAB_00661b26;
          }
          if (local_17b == 0x20) {
            (*local_170.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])
                      (&local_170,aBStack_8138 + 0x7fb1,1);
            (*local_170.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])
                      (&local_170,aBStack_8138 + 0x7fb2,1);
            (*local_170.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])
                      (&local_170,aBStack_8138 + 0x7fb3,1);
            (*local_170.super_FileReader.super_FileReaderBase._vptr_FileReaderBase[2])
                      (&local_170,aBStack_8138 + 0x7fb0,1);
            if ((local_171 & 0xf) != 8) goto LAB_00661b26;
            if (-1 < (char)aBStack_8138[0x7fb0]) {
              BVar2 = '\0';
              goto LAB_00661b54;
            }
            goto LAB_00661b2a;
          }
          BVar2 = '\0';
          aBStack_8138[0x7fb0] = '\0';
          local_187 = 0;
          local_186 = 0;
          local_185 = 0;
        }
LAB_00661b54:
        local_138[lVar18] = BVar2;
      } while ((lVar18 < 0xff) && (lVar18 = lVar18 + 1, lVar18 < (long)local_17d + (long)local_17f))
      ;
    }
  }
  bVar1 = local_172 >> 3;
  uVar12 = (ulong)((uint)(this->super_FTexture).Height * (uint)(this->super_FTexture).Width *
                  (uint)bVar1);
  buffer = (ushort *)operator_new__(uVar12);
  if (local_180 < 4) {
    FWadLump::Read(&local_170,buffer,uVar12);
  }
  else {
    ReadCompressed(this,&local_170.super_FileReader,(BYTE *)buffer,(uint)bVar1);
  }
  uVar15 = (uint)local_172;
  uVar8 = (uint)(local_172 >> 3);
  uVar12 = (ulong)uVar8;
  uVar7 = (this->super_FTexture).Width;
  uVar9 = uVar7 * uVar8;
  puVar4 = buffer;
  if ((local_171 & 0x20) == 0) {
    uVar11 = (ulong)uVar9;
    uVar9 = -uVar9;
    puVar4 = (ushort *)((long)buffer + uVar11 * ((ulong)(this->super_FTexture).Height - 1));
  }
  local_180 = local_180 & 7;
  if (local_180 == 3) {
    if (local_172 == 8) {
      WVar13 = (this->super_FTexture).Height;
      if (WVar13 != 0) {
        uVar11 = 0;
        do {
          uVar8 = 0;
          if (uVar7 == 0) {
            uVar7 = 0;
          }
          else {
            puVar14 = (ushort *)(uVar11 * (long)(int)uVar9 + (long)puVar4);
            do {
              this->Pixels[(ulong)((this->super_FTexture).Height * uVar8) + (uVar11 & 0xffffffff)] =
                   FTexture::GrayMap[(byte)*puVar14];
              puVar14 = (ushort *)((long)puVar14 + uVar12);
              uVar8 = uVar8 + 1;
              uVar7 = (this->super_FTexture).Width;
            } while (uVar8 < uVar7);
            WVar13 = (this->super_FTexture).Height;
          }
          uVar11 = uVar11 + 1;
        } while (uVar11 < WVar13);
      }
    }
    else if ((uVar15 == 0x10) && (WVar13 = (this->super_FTexture).Height, WVar13 != 0)) {
      pbVar5 = (byte *)((long)puVar4 + 1);
      uVar11 = 0;
      do {
        uVar8 = 0;
        if (uVar7 == 0) {
          uVar7 = 0;
        }
        else {
          pbVar16 = pbVar5;
          do {
            this->Pixels[(ulong)((this->super_FTexture).Height * uVar8) + (uVar11 & 0xffffffff)] =
                 FTexture::GrayMap[*pbVar16];
            uVar8 = uVar8 + 1;
            uVar7 = (this->super_FTexture).Width;
            pbVar16 = pbVar16 + uVar12;
          } while (uVar8 < uVar7);
          WVar13 = (this->super_FTexture).Height;
        }
        uVar11 = uVar11 + 1;
        pbVar5 = pbVar5 + (int)uVar9;
      } while (uVar11 < WVar13);
    }
  }
  else if (local_180 == 2) {
    if (uVar15 - 0xf < 2) {
      WVar13 = (this->super_FTexture).Height;
      if (WVar13 != 0) {
        uVar12 = 0;
        do {
          uVar15 = 0;
          if (uVar7 == 0) {
            uVar7 = 0;
          }
          else {
            puVar14 = puVar4;
            do {
              uVar7 = *puVar14;
              this->Pixels[(ulong)((this->super_FTexture).Height * uVar15) + (uVar12 & 0xffffffff)]
                   = RGB32k.All
                     [(ulong)(uVar7 & 0x1f) + (ulong)(uVar7 & 0x3e0) + (ulong)(uVar7 & 0x7c00)];
              uVar15 = uVar15 + 1;
              uVar7 = (this->super_FTexture).Width;
              puVar14 = (ushort *)((long)puVar14 + (ulong)(uVar8 & 0xfffffffe));
            } while (uVar15 < uVar7);
            WVar13 = (this->super_FTexture).Height;
          }
          uVar12 = uVar12 + 1;
          puVar4 = (ushort *)((long)puVar4 + (long)(int)uVar9);
        } while (uVar12 < WVar13);
      }
    }
    else if (uVar15 == 0x20) {
      uVar10 = (this->super_FTexture).Height;
      if ((local_171 & 0xf) == 8) {
        if (uVar10 != 0) {
          pcVar6 = (char *)((long)puVar4 + 3);
          uVar11 = 0;
          do {
            uVar8 = 0;
            if (uVar7 == 0) {
              uVar7 = 0;
            }
            else {
              pcVar17 = pcVar6;
              do {
                if (*pcVar17 < '\0') {
                  BVar2 = RGB32k.All
                          [(ulong)((byte)pcVar17[-3] >> 3) +
                           (ulong)((byte)pcVar17[-2] & 0xfffffff8) * 4 +
                           (ulong)(((byte)pcVar17[-1] & 0xf8) << 7)];
                }
                else {
                  BVar2 = '\0';
                }
                this->Pixels[(ulong)((this->super_FTexture).Height * uVar8) + (uVar11 & 0xffffffff)]
                     = BVar2;
                uVar8 = uVar8 + 1;
                uVar7 = (this->super_FTexture).Width;
                pcVar17 = pcVar17 + uVar12;
              } while (uVar8 < uVar7);
              uVar10 = (this->super_FTexture).Height;
            }
            uVar11 = uVar11 + 1;
            pcVar6 = pcVar6 + (int)uVar9;
          } while (uVar11 < uVar10);
        }
      }
      else if (uVar10 != 0) {
        puVar4 = puVar4 + 1;
        uVar11 = 0;
        do {
          uVar8 = 0;
          if (uVar7 == 0) {
            uVar7 = 0;
          }
          else {
            puVar14 = puVar4;
            do {
              this->Pixels[(ulong)((this->super_FTexture).Height * uVar8) + (uVar11 & 0xffffffff)] =
                   RGB32k.All
                   [(ulong)(byte)((byte)puVar14[-1] >> 3) +
                    (ulong)(*(byte *)((long)puVar14 + -1) & 0xfffffff8) * 4 +
                    (ulong)(((byte)*puVar14 & 0xf8) << 7)];
              uVar8 = uVar8 + 1;
              uVar7 = (this->super_FTexture).Width;
              puVar14 = (ushort *)((long)puVar14 + uVar12);
            } while (uVar8 < uVar7);
            uVar10 = (this->super_FTexture).Height;
          }
          uVar11 = uVar11 + 1;
          puVar4 = (ushort *)((long)puVar4 + (long)(int)uVar9);
        } while (uVar11 < uVar10);
      }
    }
    else if ((uVar15 == 0x18) && (WVar13 = (this->super_FTexture).Height, WVar13 != 0)) {
      puVar4 = puVar4 + 1;
      uVar11 = 0;
      do {
        uVar8 = 0;
        if (uVar7 == 0) {
          uVar7 = 0;
        }
        else {
          puVar14 = puVar4;
          do {
            this->Pixels[(ulong)((this->super_FTexture).Height * uVar8) + (uVar11 & 0xffffffff)] =
                 RGB32k.All
                 [(ulong)(byte)((byte)puVar14[-1] >> 3) +
                  (ulong)(*(byte *)((long)puVar14 + -1) & 0xfffffff8) * 4 +
                  (ulong)(((byte)*puVar14 & 0xf8) << 7)];
            uVar8 = uVar8 + 1;
            uVar7 = (this->super_FTexture).Width;
            puVar14 = (ushort *)((long)puVar14 + uVar12);
          } while (uVar8 < uVar7);
          WVar13 = (this->super_FTexture).Height;
        }
        uVar11 = uVar11 + 1;
        puVar4 = (ushort *)((long)puVar4 + (long)(int)uVar9);
      } while (uVar11 < WVar13);
    }
  }
  else if ((local_180 == 1) && (WVar13 = (this->super_FTexture).Height, WVar13 != 0)) {
    uVar11 = 0;
    do {
      uVar8 = 0;
      if (uVar7 == 0) {
        uVar7 = 0;
      }
      else {
        puVar14 = (ushort *)(uVar11 * (long)(int)uVar9 + (long)puVar4);
        do {
          this->Pixels[(ulong)((this->super_FTexture).Height * uVar8) + (uVar11 & 0xffffffff)] =
               local_138[(byte)*puVar14];
          puVar14 = (ushort *)((long)puVar14 + uVar12);
          uVar8 = uVar8 + 1;
          uVar7 = (this->super_FTexture).Width;
        } while (uVar8 < uVar7);
        WVar13 = (this->super_FTexture).Height;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < WVar13);
  }
  operator_delete__(buffer);
  FWadLump::~FWadLump(&local_170);
  return;
}

Assistant:

void FTGATexture::MakeTexture ()
{
	BYTE PaletteMap[256];
	FWadLump lump = Wads.OpenLumpNum (SourceLump);
	TGAHeader hdr;
	WORD w;
	BYTE r,g,b,a;
	BYTE * buffer;

	Pixels = new BYTE[Width*Height];
	lump.Read(&hdr, sizeof(hdr));
	lump.Seek(hdr.id_len, SEEK_CUR);
	
	hdr.width = LittleShort(hdr.width);
	hdr.height = LittleShort(hdr.height);
	hdr.cm_first = LittleShort(hdr.cm_first);
	hdr.cm_length = LittleShort(hdr.cm_length);

	if (hdr.has_cm)
	{
		memset(PaletteMap, 0, 256);
		for (int i = hdr.cm_first; i < hdr.cm_first + hdr.cm_length && i < 256; i++)
		{
			switch (hdr.cm_size)
			{
			case 15:
			case 16:
				lump >> w;
				r = (w & 0x001F) << 3;
				g = (w & 0x03E0) >> 2;
				b = (w & 0x7C00) >> 7;
				a = 255;
				break;
				
			case 24:
				lump >> b >> g >> r;
				a=255;
				break;
				
			case 32:
				lump >> b >> g >> r >> a;
				if ((hdr.img_desc&15)!=8) a=255;
				break;
				
			default:	// should never happen
				r=g=b=a=0;
				break;
			}
			PaletteMap[i] = a>=128? ColorMatcher.Pick(r, g, b) : 0;
		}
    }
    
    int Size = Width * Height * (hdr.bpp>>3);
   	buffer = new BYTE[Size];
   	
    if (hdr.img_type < 4)	// uncompressed
    {
    	lump.Read(buffer, Size);
    }
    else				// compressed
    {
    	ReadCompressed(lump, buffer, hdr.bpp>>3);
    }
    
	BYTE * ptr = buffer;
	int step_x = (hdr.bpp>>3);
	int Pitch = Width * step_x;

	/*
	if (hdr.img_desc&32)
	{
		ptr += (Width-1) * step_x;
		step_x =- step_x;
	}
	*/
	if (!(hdr.img_desc&32))
	{
		ptr += (Height-1) * Pitch;
		Pitch = -Pitch;
	}

    switch (hdr.img_type & 7)
    {
	case 1:	// paletted
		for(int y=0;y<Height;y++)
		{
			BYTE * p = ptr + y * Pitch;
			for(int x=0;x<Width;x++)
			{
				Pixels[x*Height+y] = PaletteMap[*p];
				p+=step_x;
			}
		}
		break;

	case 2:	// RGB
		switch (hdr.bpp)
		{
		case 15:
		case 16:
			step_x>>=1;
			for(int y=0;y<Height;y++)
			{
				WORD * p = (WORD*)(ptr + y * Pitch);
				for(int x=0;x<Width;x++)
				{
					int v = LittleLong(*p);
					Pixels[x*Height+y] = RGB32k.RGB[(v>>10) & 0x1f][(v>>5) & 0x1f][v & 0x1f];
					p+=step_x;
				}
			}
			break;
		
		case 24:
			for(int y=0;y<Height;y++)
			{
				BYTE * p = ptr + y * Pitch;
				for(int x=0;x<Width;x++)
				{
					Pixels[x*Height+y] = RGB32k.RGB[p[2]>>3][p[1]>>3][p[0]>>3];
					p+=step_x;
				}
			}
			break;
		
		case 32:
			if ((hdr.img_desc&15)!=8)	// 32 bits without a valid alpha channel
			{
				for(int y=0;y<Height;y++)
				{
					BYTE * p = ptr + y * Pitch;
					for(int x=0;x<Width;x++)
					{
						Pixels[x*Height+y] = RGB32k.RGB[p[2]>>3][p[1]>>3][p[0]>>3];
						p+=step_x;
					}
				}
			}
			else
			{
				for(int y=0;y<Height;y++)
				{
					BYTE * p = ptr + y * Pitch;
					for(int x=0;x<Width;x++)
					{
						Pixels[x*Height+y] = p[3] >= 128? RGB32k.RGB[p[2]>>3][p[1]>>3][p[0]>>3] : 0;
						p+=step_x;
					}
				}
			}
			break;
		
		default:
			break;
		}
		break;
	
	case 3:	// Grayscale
		switch (hdr.bpp)
		{
		case 8:
			for(int y=0;y<Height;y++)
			{
				BYTE * p = ptr + y * Pitch;
				for(int x=0;x<Width;x++)
				{
					Pixels[x*Height+y] = GrayMap[*p];
					p+=step_x;
				}
			}
			break;
		
		case 16:
			for(int y=0;y<Height;y++)
			{
				BYTE * p = ptr + y * Pitch;
				for(int x=0;x<Width;x++)
				{
					Pixels[x*Height+y] = GrayMap[p[1]];	// only use the high byte
					p+=step_x;
				}
			}
			break;
		
		default:
			break;
		}
		break;

	default:
		break;
    }
	delete [] buffer;
}